

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O3

void __thiscall SuiteTimeRangeTests::TestisInRange::RunImpl(TestisInRange *this)

{
  TestResults *pTVar1;
  char cVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails TStack_2c8;
  DateTime local_2a8;
  DateTime local_290;
  DateTime local_278;
  DateTime local_260;
  DateTime local_248;
  DateTime local_230;
  DateTime local_218;
  DateTime local_200;
  DateTime local_1e8;
  DateTime local_1d0;
  DateTime local_1b8;
  DateTime local_1a0;
  DateTime local_188;
  DateTime local_170;
  DateTime local_158;
  DateTime local_140;
  DateTime local_128;
  DateTime local_110;
  DateTime local_f8;
  DateTime local_e0;
  DateTime local_c8;
  DateTime local_b0;
  DateTime local_98;
  DateTime local_80;
  DateTime local_68;
  DateTime local_50;
  DateTime local_38;
  
  local_278._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_278.m_date = 0;
  local_278.m_time = 10800000000000;
  local_290._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_290.m_date = 0;
  local_290.m_time = 64800000000000;
  local_2a8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_2a8.m_date = 0x256974;
  local_2a8.m_time = 36000000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_278,&local_290,&local_2a8);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x2a);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"TimeRange::isInRange( start, end, now )");
  }
  local_230._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_230.m_date = 0;
  local_230.m_time = 10800000000000;
  local_248._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_248.m_date = 0;
  local_248.m_time = 64800000000000;
  local_260._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_260.m_date = 0x256974;
  local_260.m_time = 64800000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_230,&local_248,&local_260);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x2d);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"TimeRange::isInRange( start, end, now )");
  }
  local_1e8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1e8.m_date = 0;
  local_1e8.m_time = 10800000000000;
  local_200._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_200.m_date = 0;
  local_200.m_time = 64800000000000;
  local_218._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_218.m_date = 0x256974;
  local_218.m_time = 7200000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_1e8,&local_200,&local_218);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x30);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"!TimeRange::isInRange( start, end, now )");
  }
  local_1a0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1a0.m_date = 0;
  local_1a0.m_time = 10800000000000;
  local_1b8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1b8.m_date = 0;
  local_1b8.m_time = 64800000000000;
  local_1d0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1d0.m_date = 0x256974;
  local_1d0.m_time = 68400000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_1a0,&local_1b8,&local_1d0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x33);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"!TimeRange::isInRange( start, end, now )");
  }
  local_158._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_158.m_date = 0;
  local_158.m_time = 10800000000000;
  local_170._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_170.m_date = 0;
  local_170.m_time = 64800000000000;
  local_188._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_188.m_date = 0x256974;
  local_188.m_time = 0x3aefa8960a00;
  cVar2 = FIX::TimeRange::isInRange(&local_158,&local_170,&local_188);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x36);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"!TimeRange::isInRange( start, end, now )");
  }
  local_110._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_110.m_date = 0;
  local_110.m_time = 64800000000000;
  local_128._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_128.m_date = 0;
  local_128.m_time = 10800000000000;
  local_140._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_140.m_date = 0x256974;
  local_140.m_time = 64800000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_110,&local_128,&local_140);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x3b);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"TimeRange::isInRange( start, end, now )");
  }
  local_c8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_c8.m_date = 0;
  local_c8.m_time = 64800000000000;
  local_e0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_e0.m_date = 0;
  local_e0.m_time = 10800000000000;
  local_f8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_f8.m_date = 0x256974;
  local_f8.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_c8,&local_e0,&local_f8);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x3e);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"TimeRange::isInRange( start, end, now )");
  }
  local_80._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_80.m_date = 0;
  local_80.m_time = 64800000000000;
  local_98._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_98.m_date = 0;
  local_98.m_time = 10800000000000;
  local_b0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_b0.m_date = 0x256974;
  local_b0.m_time = 14400000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_80,&local_98,&local_b0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x41);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"!TimeRange::isInRange( start, end, now )");
  }
  local_38._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_38.m_date = 0;
  local_38.m_time = 64800000000000;
  local_50._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_50.m_date = 0;
  local_50.m_time = 10800000000000;
  local_68._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_68.m_date = 0x256974;
  local_68.m_time = 61200000000000;
  cVar2 = FIX::TimeRange::isInRange(&local_38,&local_50,&local_68);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_2c8,*ppTVar4,0x44);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&TStack_2c8,"!TimeRange::isInRange( start, end, now )");
  }
  return;
}

Assistant:

TEST(isInRange)
{
  UtcTimeOnly start( 3, 0, 0 );
  UtcTimeOnly end( 18, 0, 0 );

  UtcTimeStamp now( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 18, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 2, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 18, 0, 1, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  start = UtcTimeOnly( 18, 0, 0 );
  end = UtcTimeOnly( 3, 0, 0 );
  now = UtcTimeStamp( 18, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 3, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 4, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 17, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );
}